

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O3

void __thiscall OrPattern::~OrPattern(OrPattern *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__OrPattern_003ce298;
  ppDVar2 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppDVar1 = (this->orlist).super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppDVar2 != ppDVar1) {
    do {
      if (*ppDVar2 != (DisjointPattern *)0x0) {
        (*((*ppDVar2)->super_Pattern)._vptr_Pattern[1])();
        ppDVar1 = (this->orlist).
                  super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      ppDVar2 = ppDVar2 + 1;
    } while (ppDVar2 != ppDVar1);
    ppDVar2 = (this->orlist).
              super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppDVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppDVar2);
  return;
}

Assistant:

OrPattern::~OrPattern(void)

{
  vector<DisjointPattern *>::iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    delete *iter;
}